

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryEnabledDiagnosticsTrace(RecyclableObject *function,CallInfo callInfo,...)

{
  EventLog *this;
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  bool isEnabled_1;
  EventLog *ttlog_1;
  bool isEnabled;
  EventLog *ttlog;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x65a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&ttlog,(CallInfo *)&function_local,values);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  bVar2 = ScriptContext::ShouldPerformReplayAction(pSVar3);
  if (bVar2) {
    pSVar3 = RecyclableObject::GetScriptContext(function);
    pTVar4 = ScriptContext::GetThreadContext(pSVar3);
    bVar2 = TTD::EventLog::ReplayTTDFetchAutoTraceStatusLogEvent(pTVar4->TTDLog);
    pSVar3 = RecyclableObject::GetScriptContext(function);
    pJVar6 = ScriptContext::GetLibrary(pSVar3);
    callInfo_local = (CallInfo)JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
  }
  else {
    pSVar3 = RecyclableObject::GetScriptContext(function);
    bVar2 = ScriptContext::ShouldPerformRecordAction(pSVar3);
    if (bVar2) {
      pSVar3 = RecyclableObject::GetScriptContext(function);
      pTVar4 = ScriptContext::GetThreadContext(pSVar3);
      this = pTVar4->TTDLog;
      bVar2 = TTD::EventLog::GetAutoTraceEnabled(this);
      TTD::EventLog::RecordTTDFetchAutoTraceStatusEvent(this,bVar2);
      pSVar3 = RecyclableObject::GetScriptContext(function);
      pJVar6 = ScriptContext::GetLibrary(pSVar3);
      callInfo_local = (CallInfo)JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
    }
    else {
      pSVar3 = RecyclableObject::GetScriptContext(function);
      pJVar6 = ScriptContext::GetLibrary(pSVar3);
      callInfo_local =
           (CallInfo)JavascriptLibraryBase::GetFalse(&pJVar6->super_JavascriptLibraryBase);
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var GlobalObject::EntryEnabledDiagnosticsTrace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        if (function->GetScriptContext()->ShouldPerformReplayAction())
        {
            TTD::EventLog* ttlog = function->GetScriptContext()->GetThreadContext()->TTDLog;
            bool isEnabled = ttlog->ReplayTTDFetchAutoTraceStatusLogEvent();

            return function->GetScriptContext()->GetLibrary()->CreateBoolean(isEnabled);
        }
        else if (function->GetScriptContext()->ShouldPerformRecordAction())
        {
            TTD::EventLog* ttlog = function->GetScriptContext()->GetThreadContext()->TTDLog;
            bool isEnabled = ttlog->GetAutoTraceEnabled();
            ttlog->RecordTTDFetchAutoTraceStatusEvent(isEnabled);

            return function->GetScriptContext()->GetLibrary()->CreateBoolean(isEnabled);
        }
        else
        {
            return function->GetScriptContext()->GetLibrary()->GetFalse();
        }
    }